

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

NESTresult * __thiscall
NEST::NESTcalc::GetYieldERdEOdxBasis
          (NESTresult *__return_storage_ptr__,NESTcalc *this,
          vector<double,_std::allocator<double>_> *dEOdxParam,string *muonInitPos,
          vector<double,_std::allocator<double>_> *vTable,
          vector<double,_std::allocator<double>_> *NRERWidthsParam)

{
  double dVar1;
  double dVar2;
  double a;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  pointer pdVar7;
  pointer pcVar8;
  pointer pdVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  long lVar15;
  int *piVar16;
  NESTcalc *this_00;
  RandomGen *pRVar17;
  int64_t iVar18;
  double *pdVar19;
  runtime_error *this_01;
  undefined8 uVar20;
  int iVar21;
  NESTcalc *pNVar22;
  NESTcalc **__endptr;
  double *pdVar23;
  uint uVar24;
  VDetector *pVVar25;
  QuantaResult *pQVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  float fVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double extraout_XMM0_Qa;
  double dVar35;
  double dVar36;
  double dVar37;
  double extraout_XMM0_Qa_00;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar40 [16];
  double dVar41;
  NESTresult *result;
  string position;
  string delimiter;
  string token;
  double local_238;
  ulong uStack_230;
  double local_218;
  double local_210;
  double local_208;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1b8;
  undefined4 local_188;
  uint uStack_184;
  undefined1 local_178 [16];
  double local_150;
  double local_138;
  NESTcalc *local_130;
  int local_128;
  int local_124;
  NESTcalc *local_120;
  double dStack_118;
  undefined1 local_110 [24];
  double dStack_f8;
  long *local_f0 [2];
  long local_e0 [2];
  double local_d0;
  NESTcalc *local_c8 [2];
  undefined1 local_b8 [24];
  undefined8 uStack_a0;
  double local_98;
  double dStack_90;
  QuantaResult *local_88;
  double local_80;
  double local_78;
  vector<double,_std::allocator<double>_> *local_70;
  undefined4 local_68;
  uint uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  
  bVar14 = this->fdetector->OldW13eV;
  this_00 = (NESTcalc *)(ulong)bVar14;
  pNVar22 = this;
  local_70 = vTable;
  WorkFunction((dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[8],this->fdetector->molarMass,bVar14);
  iVar27 = (int)pNVar22;
  pdVar7 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar7[8];
  dVar2 = this->fdetector->TopDrift;
  a = pdVar7[4];
  dVar3 = pdVar7[5];
  local_d0 = pdVar7[6];
  bVar14 = ValidityTests::nearlyEqual(a,0.0,1e-09);
  if ((NAN(a)) || (bVar14)) {
LAB_001082d5:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Energy cannot be zero or undefined");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->quanta).recombProb = 0.0;
  (__return_storage_ptr__->quanta).Variance = 0.0;
  (__return_storage_ptr__->quanta).photons = 0;
  (__return_storage_ptr__->quanta).electrons = 0;
  (__return_storage_ptr__->quanta).ions = 0;
  (__return_storage_ptr__->quanta).excitons = 0;
  (__return_storage_ptr__->yields).ElectricField = 0.0;
  (__return_storage_ptr__->yields).DeltaT_Scint = 0.0;
  (__return_storage_ptr__->yields).ExcitonRatio = 0.0;
  (__return_storage_ptr__->yields).Lindhard = 0.0;
  (__return_storage_ptr__->yields).PhotonYield = 0.0;
  (__return_storage_ptr__->yields).ElectronYield = 0.0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar19 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  dVar4 = *pdVar19;
  dVar5 = pdVar19[1];
  dVar33 = pdVar19[2];
  bVar14 = ValidityTests::nearlyEqual(pdVar19[3],-1.0,1e-09);
  if (bVar14) {
    if ((0.0 <= a) ||
       (pdVar19 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start, 0.0 < *pdVar19 || *pdVar19 == 0.0)) {
      dVar34 = this->fdetector->radmax;
      pRVar17 = RandomGen::rndm();
      dVar32 = RandomGen::rand_uniform(pRVar17);
      if (dVar32 < 0.0) {
        dVar32 = sqrt(dVar32);
      }
      else {
        dVar32 = SQRT(dVar32);
      }
      this_00 = (NESTcalc *)RandomGen::rndm();
      dVar37 = RandomGen::rand_uniform((RandomGen *)this_00);
      dVar34 = dVar34 * dVar32;
      local_210 = cos(dVar37 * 6.283185307179586);
      local_210 = local_210 * dVar34;
      local_218 = sin(dVar37 * 6.283185307179586);
      local_218 = local_218 * dVar34;
    }
    else {
      local_210 = dVar4 + -10.0;
      dVar2 = dVar33;
      local_218 = dVar5;
    }
  }
  else {
    local_120 = (NESTcalc *)local_110;
    pcVar8 = (muonInitPos->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar8,pcVar8 + muonInitPos->_M_string_length);
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,",","");
    iVar27 = 0;
    lVar15 = std::__cxx11::string::find((char *)&local_120,(ulong)local_f0[0],0);
    if (lVar15 == -1) {
      local_218 = -999.0;
      local_210 = -999.0;
    }
    else {
      local_210 = -999.0;
      local_218 = -999.0;
      do {
        std::__cxx11::string::substr((ulong)local_c8,(ulong)&local_120);
        pNVar22 = local_c8[0];
        piVar16 = __errno_location();
        bVar14 = iVar27 == 0;
        iVar27 = iVar27 + -1;
        if (bVar14) {
          iVar21 = *piVar16;
          *piVar16 = 0;
          fVar31 = strtof((char *)pNVar22,(char **)&local_130);
          if (local_130 == pNVar22) {
            std::__throw_invalid_argument("stof");
LAB_001082b1:
            std::__throw_invalid_argument("stof");
LAB_001082bd:
            std::__throw_out_of_range("stof");
LAB_001082c9:
            std::__throw_out_of_range("stof");
            goto LAB_001082d5;
          }
          if (*piVar16 == 0) {
            *piVar16 = iVar21;
          }
          else if (*piVar16 == 0x22) goto LAB_001082c9;
          local_210 = (double)fVar31;
        }
        else {
          iVar21 = *piVar16;
          *piVar16 = 0;
          fVar31 = strtof((char *)pNVar22,(char **)&local_130);
          if (local_130 == pNVar22) goto LAB_001082b1;
          if (*piVar16 == 0) {
            *piVar16 = iVar21;
          }
          else if (*piVar16 == 0x22) goto LAB_001082bd;
          local_218 = (double)fVar31;
        }
        std::__cxx11::string::erase((ulong)&local_120,0);
        if (local_c8[0] != (NESTcalc *)local_b8) {
          operator_delete(local_c8[0],local_b8._0_8_ + 1);
        }
        lVar15 = std::__cxx11::string::find((char *)&local_120,(ulong)local_f0[0],0);
      } while (lVar15 != -1);
    }
    pNVar22 = local_120;
    piVar16 = __errno_location();
    iVar21 = *piVar16;
    *piVar16 = 0;
    __endptr = local_c8;
    fVar31 = strtof((char *)pNVar22,(char **)__endptr);
    iVar27 = (int)__endptr;
    if (local_c8[0] == pNVar22) {
      uVar20 = std::__throw_invalid_argument("stof");
      if (local_120 != (NESTcalc *)local_110) {
        operator_delete(local_120,local_110._0_8_ + 1);
      }
      pdVar7 = (__return_storage_ptr__->photon_times).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (pdVar7 != (pointer)0x0) {
        operator_delete(pdVar7,(long)(__return_storage_ptr__->photon_times).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage - (long)pdVar7);
      }
      _Unwind_Resume(uVar20);
    }
    if (*piVar16 == 0) {
LAB_00107534:
      *piVar16 = iVar21;
    }
    else if (*piVar16 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00107534;
    }
    if (local_f0[0] != local_e0) {
      uVar30 = local_e0[0] + 1;
      operator_delete(local_f0[0],uVar30);
      iVar27 = (int)uVar30;
    }
    this_00 = local_120;
    if (local_120 != (NESTcalc *)local_110) {
      uVar30 = local_110._0_8_ + 1;
      operator_delete(local_120,uVar30);
      iVar27 = (int)uVar30;
    }
    dVar2 = (double)fVar31;
  }
  if (dVar2 <= 0.0) {
    dVar2 = this->fdetector->TopDrift;
  }
  if (0.0 <= a) {
    local_208 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[9];
    local_238 = dVar1 * a * dVar3 * 100.0;
    goto LAB_0010770b;
  }
  local_208 = -a;
  pdVar7 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar34 = pdVar7[10];
  if (dVar34 <= 0.0) {
LAB_001076b0:
    dVar34 = CalcElectronLET(this_00,local_208,iVar27,(bool)(-(dVar34 != 0.0) & 1));
  }
  else {
    dVar32 = pdVar7[0xb];
    if ((dVar32 == 0.0) && (!NAN(dVar32))) goto LAB_001076b0;
    dVar32 = pow(local_208,dVar32);
    dVar34 = dVar34 * dVar32;
  }
  pRVar17 = RandomGen::rndm();
  local_238 = RandomGen::rand_zero_trunc_gauss(pRVar17,dVar34,dVar34);
  local_238 = dVar1 * dVar3 * 100.0 * local_238;
LAB_0010770b:
  uStack_230 = 0;
  local_98 = 0.0;
  if (0.0 <= dVar33) {
    local_98 = dVar33;
  }
  dVar32 = dVar4 - local_210;
  dVar33 = dVar5 - local_218;
  dStack_90 = 0.0;
  local_b8._16_8_ = local_98 - dVar2;
  uStack_a0 = 0;
  dVar34 = (double)local_b8._16_8_ * (double)local_b8._16_8_ + dVar32 * dVar32 + dVar33 * dVar33;
  if (dVar34 < 0.0) {
    dVar34 = sqrt(dVar34);
  }
  else {
    dVar34 = SQRT(dVar34);
  }
  pVVar25 = this->fdetector;
  local_1d8 = dVar2;
  if ((pVVar25->radmax * pVVar25->radmax <= local_210 * local_210 + local_218 * local_218) ||
     (ABS(local_208) <= 1e-06)) {
    iVar27 = 0;
    iVar21 = 0;
    local_1e0 = local_210;
    local_1e8 = local_218;
  }
  else {
    pQVar26 = &__return_storage_ptr__->quanta;
    local_78 = dVar3 * 4.0 * dVar3;
    local_188 = SUB84(a,0);
    uStack_184 = (uint)((ulong)a >> 0x20);
    uStack_64 = uStack_184 ^ 0x80000000;
    uStack_5c = 0x80000000;
    local_68 = local_188;
    uStack_60 = 0;
    iVar21 = 0;
    local_48 = -(ulong)(dVar2 <= local_98);
    lStack_40 = -(ulong)(0.0 <= dStack_90);
    local_58 = -(ulong)(local_98 <= dVar2);
    lStack_50 = -(ulong)(dStack_90 <= 0.0);
    local_b8._16_8_ = ((double)local_b8._16_8_ / dVar34) * dVar3;
    iVar27 = 0;
    local_1e8 = local_218;
    local_1e0 = local_210;
    local_138 = 0.0;
    local_88 = pQVar26;
    while (((auVar38._8_8_ = -(ulong)(dStack_90 < 0.0),
            auVar38._0_8_ = -(ulong)(local_98 < local_1d8), auVar13._8_8_ = lStack_40,
            auVar13._0_8_ = local_48,
            ((auVar38 | auVar13) & (undefined1  [16])0x1) != (undefined1  [16])0x0 &&
            (auVar39._8_8_ = -(ulong)(0.0 < dStack_90),
            auVar39._0_8_ = -(ulong)(local_1d8 < local_98), auVar12._8_8_ = lStack_50,
            auVar12._0_8_ = local_58,
            ((auVar39 | auVar12) & (undefined1  [16])0x1) != (undefined1  [16])0x0)) ||
           (local_78 <=
            (local_1e0 - dVar4) * (local_1e0 - dVar4) + (local_1e8 - dVar5) * (local_1e8 - dVar5))))
    {
      dVar37 = local_d0;
      if ((local_d0 == -1.0) && (!NAN(local_d0))) {
        (*pVVar25->_vptr_VDetector[4])(local_1e0,SUB84(local_1e8,0),local_1d8);
        dVar37 = extraout_XMM0_Qa;
      }
      if (0.0 <= a) {
        (*this->_vptr_NESTcalc[10])(&local_120,this,&default_ERYieldsParam);
        (__return_storage_ptr__->yields).ElectricField = (double)local_110._16_8_;
        (__return_storage_ptr__->yields).DeltaT_Scint = dStack_f8;
        (__return_storage_ptr__->yields).ExcitonRatio = (double)local_110._0_8_;
        (__return_storage_ptr__->yields).Lindhard = (double)local_110._8_8_;
        (__return_storage_ptr__->yields).PhotonYield = (double)local_120;
        (__return_storage_ptr__->yields).ElectronYield = dStack_118;
        local_178._8_8_ = uStack_230;
        local_178._0_8_ = local_238;
      }
      else {
        dVar35 = (double)CONCAT44(uStack_64,local_68);
        auVar11._8_4_ = uStack_60;
        auVar11._0_8_ = dVar35;
        auVar11._12_4_ = uStack_5c;
        uVar30 = -(ulong)(dVar35 < local_238 + local_138);
        auVar40._0_8_ = ~uVar30 & (ulong)local_238;
        auVar40._8_8_ = ~auVar11._8_8_ & uStack_230;
        auVar10._8_4_ = uStack_60;
        auVar10._0_8_ = (ulong)(dVar35 - local_138) & uVar30;
        auVar10._12_4_ = uStack_5c;
        local_178 = auVar40 | auVar10;
        pdVar19 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        dVar35 = local_178._0_8_;
        if (0.0 <= *pdVar19) {
          (*this->_vptr_NESTcalc[10])
                    (dVar35,SUB84(dVar1,0),dVar37,&local_120,this,&default_ERYieldsParam);
          (__return_storage_ptr__->yields).ElectricField = (double)local_110._16_8_;
          (__return_storage_ptr__->yields).DeltaT_Scint = dStack_f8;
          (__return_storage_ptr__->yields).ExcitonRatio = (double)local_110._0_8_;
          (__return_storage_ptr__->yields).Lindhard = (double)local_110._8_8_;
          (__return_storage_ptr__->yields).PhotonYield = (double)local_120;
          (__return_storage_ptr__->yields).ElectronYield = dStack_118;
        }
        else {
          local_150 = dVar35 * -*pdVar19;
          dVar41 = local_150 / (pdVar19[1] + 1.0);
          dVar36 = pdVar19[3];
          dVar35 = pow(dVar35,pdVar19[4] + -1.0);
          local_1b8 = dVar35 * dVar36 * 0.25 * dVar41;
          pdVar7 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_80 = pdVar7[1] + 1.0;
          dVar35 = log(pdVar7[2] + local_1b8);
          dVar41 = (local_80 - dVar35 / local_1b8) * dVar41;
          dVar35 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[1];
          (__return_storage_ptr__->yields).PhotonYield = dVar41;
          (__return_storage_ptr__->yields).ElectronYield = local_150 - dVar41;
          (__return_storage_ptr__->yields).ExcitonRatio = dVar35;
          (__return_storage_ptr__->yields).Lindhard = 1.0;
          (__return_storage_ptr__->yields).ElectricField = dVar37;
          (__return_storage_ptr__->yields).DeltaT_Scint = -999.0;
        }
      }
      if ((0.0 <= a) ||
         (pdVar19 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start, 0.0 < *pdVar19 || *pdVar19 == 0.0)) {
        (*this->_vptr_NESTcalc[0xc])
                  (dVar1,0,&local_120,this,__return_storage_ptr__,&default_NRERWidthsParam);
        pQVar26->recombProb = (double)local_110._0_8_;
        pQVar26->Variance = (double)local_110._8_8_;
        *(NESTcalc **)pQVar26 = local_120;
        *(double *)&pQVar26->ions = dStack_118;
      }
      else {
        iVar28 = 0;
        uVar29 = 0;
        if (1.0 <= local_150) {
          pRVar17 = RandomGen::rndm();
          dVar37 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[5] * (double)local_178._0_8_;
          iVar18 = RandomGen::binom_draw(pRVar17,(long)dVar37,local_150 / dVar37);
          uVar29 = (uint)iVar18;
        }
        log((NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[2] + local_1b8);
        local_128 = iVar27;
        local_124 = iVar21;
        if ((0 < (int)uVar29) &&
           (1.0 < (__return_storage_ptr__->yields).PhotonYield ||
            (__return_storage_ptr__->yields).PhotonYield == 1.0)) {
          pRVar17 = RandomGen::rndm();
          iVar18 = RandomGen::binom_draw
                             (pRVar17,(ulong)uVar29,
                              (__return_storage_ptr__->yields).PhotonYield / (double)(int)uVar29);
          iVar28 = (int)iVar18;
        }
        pdVar7 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar36 = ceil((double)(int)uVar29 / (pdVar7[1] + 1.0) + -0.5);
        dVar41 = log(pdVar7[2] + local_1b8);
        dVar37 = (NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[6];
        dVar35 = (__return_storage_ptr__->yields).PhotonYield;
        (__return_storage_ptr__->quanta).photons = iVar28;
        (__return_storage_ptr__->quanta).electrons = uVar29 - iVar28;
        (__return_storage_ptr__->quanta).ions = (int)dVar36;
        (__return_storage_ptr__->quanta).excitons = uVar29 - (int)dVar36;
        (__return_storage_ptr__->quanta).recombProb = 1.0 - dVar41 / local_1b8;
        (__return_storage_ptr__->quanta).Variance = dVar37 * dVar35;
        iVar21 = local_124 + (uVar29 - iVar28);
        pQVar26 = local_88;
        iVar27 = local_128;
      }
      if (a <= 0.0) {
        if (0.0 <= *(NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start) {
          iVar28 = (__return_storage_ptr__->quanta).photons;
          iVar6 = (__return_storage_ptr__->quanta).electrons;
          pRVar17 = RandomGen::rndm();
          dVar37 = (double)(iVar6 + iVar28);
          if (dVar37 < 0.0) {
            dVar35 = sqrt(dVar37);
          }
          else {
            dVar35 = SQRT(dVar37);
          }
          dVar37 = RandomGen::rand_gauss(pRVar17,dVar37,dVar35,false);
          dVar35 = floor(dVar37 + 0.5);
          pRVar17 = RandomGen::rndm();
          iVar28 = pQVar26->photons;
          dVar37 = (double)iVar28 * 200.0;
          if (dVar37 < 0.0) {
            dVar37 = sqrt(dVar37);
          }
          else {
            dVar37 = SQRT(dVar37);
          }
          dVar37 = RandomGen::rand_gauss(pRVar17,(double)iVar28,dVar37,false);
          dVar37 = floor(dVar37 + 0.5);
          (__return_storage_ptr__->quanta).photons = (int)dVar37;
          (__return_storage_ptr__->quanta).electrons = (int)dVar35 - (int)dVar37;
        }
        iVar27 = iVar27 + pQVar26->photons;
      }
      else {
        iVar27 = (int)((double)iVar27 +
                      ((double)local_178._0_8_ / local_208) * (double)pQVar26->photons);
      }
      dVar37 = floor(local_1d8 / dVar3 + 0.5);
      pdVar7 = (local_70->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar9 = (local_70->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      uVar30 = (long)pdVar9 - (long)pdVar7 >> 3;
      uVar24 = (int)uVar30 - 1;
      pNVar22 = (NESTcalc *)(ulong)uVar24;
      uVar29 = (int)dVar37;
      if (uVar30 <= (ulong)(long)(int)dVar37) {
        uVar29 = uVar24;
      }
      pdVar23 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start + 7;
      pdVar19 = pdVar7 + (int)uVar29;
      if (pdVar9 == pdVar7) {
        pdVar19 = pdVar23;
      }
      pVVar25 = this->fdetector;
      if ((pVVar25->cathode <= local_1d8) &&
         (0.0 <= *(NRERWidthsParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start)) {
        dVar37 = (-(pVVar25->TopDrift - local_1d8) / *pdVar19) / pVVar25->eLife_us;
        if (a <= 0.0) {
          iVar28 = (__return_storage_ptr__->quanta).electrons;
          dVar37 = exp(dVar37);
          iVar21 = (int)(dVar37 * (double)iVar28 + (double)iVar21);
        }
        else {
          iVar28 = (__return_storage_ptr__->quanta).electrons;
          dVar37 = exp(dVar37);
          iVar21 = (int)(((double)local_178._0_8_ / local_208) * dVar37 * (double)iVar28 +
                        (double)iVar21);
        }
      }
      if (0.0 <= a) {
        local_238 = (double)local_178._0_8_;
        uStack_230 = local_178._8_8_;
      }
      else {
        local_208 = local_208 - (double)local_178._0_8_;
        pdVar7 = (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_238 = pdVar7[10];
        if (local_238 <= 0.0) {
LAB_001080e5:
          local_238 = CalcElectronLET(pNVar22,local_208,(int)pdVar23,(bool)(-(local_238 != 0.0) & 1)
                                     );
          uStack_230 = extraout_XMM0_Qb_00;
        }
        else {
          dVar37 = pdVar7[0xb];
          if ((dVar37 == 0.0) && (!NAN(dVar37))) goto LAB_001080e5;
          dVar37 = pow(local_208,dVar37);
          local_238 = local_238 * dVar37;
          uStack_230 = 0;
          if (0.0 < (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[0xc]) {
            pRVar17 = RandomGen::rndm();
            local_238 = RandomGen::rand_gauss
                                  (pRVar17,local_238,
                                   (dEOdxParam->super__Vector_base<double,_std::allocator<double>_>)
                                   ._M_impl.super__Vector_impl_data._M_start[0xc] * local_238,true);
            uStack_230 = extraout_XMM0_Qb;
          }
        }
        local_238 = local_238 * dVar1 * dVar3 * 100.0;
      }
      local_1e0 = local_1e0 + (dVar32 / dVar34) * dVar3;
      local_1e8 = local_1e8 + (dVar33 / dVar34) * dVar3;
      local_1d8 = local_1d8 + (double)local_b8._16_8_;
      pVVar25 = this->fdetector;
      if ((pVVar25->radmax * pVVar25->radmax <= local_1e0 * local_1e0 + local_1e8 * local_1e8) ||
         (local_138 = local_138 + (double)local_178._0_8_, ABS(local_208) <= 1e-06)) break;
    }
  }
  if (iVar27 < 1) {
    iVar27 = 0;
  }
  iVar28 = 0;
  if (0 < iVar21) {
    iVar28 = iVar21;
  }
  (__return_storage_ptr__->quanta).photons = iVar27;
  (__return_storage_ptr__->quanta).electrons = iVar28;
  if ((local_d0 == -1.0) && (!NAN(local_d0))) {
    (*pVVar25->_vptr_VDetector[4])
              ((local_210 + local_1e0) * 0.5,SUB84((local_218 + local_1e8) * 0.5,0));
    local_d0 = extraout_XMM0_Qa_00;
  }
  (__return_storage_ptr__->yields).DeltaT_Scint = (dVar2 + local_1d8) * 0.5;
  (__return_storage_ptr__->yields).ElectricField = local_d0;
  return __return_storage_ptr__;
}

Assistant:

NESTresult NESTcalc::GetYieldERdEOdxBasis(
    const std::vector<double> &dEOdxParam, string muonInitPos,
    vector<double> vTable, const std::vector<double> &NRERWidthsParam) {
  Wvalue wvalue = WorkFunction(dEOdxParam[8], fdetector->get_molarMass(),
                               fdetector->get_OldW13eV());
  double Wq_eV = wvalue.Wq_eV;
  double rho = dEOdxParam[8];
  double xi = -999., yi = -999., zi = fdetector->get_TopDrift();
  double xf, yf, zf, pos_x, pos_y, pos_z, r, phi, field,
      eMin = dEOdxParam[4], z_step = dEOdxParam[5], inField = dEOdxParam[6];
  if (ValidityTests::nearlyEqual(eMin, 0.) || std::isnan(eMin))
    throw std::runtime_error("Energy cannot be zero or undefined");
  NESTresult result{};
  xf = dEOdxParam[0];
  yf = dEOdxParam[1];
  zf = dEOdxParam[2];
  if (ValidityTests::nearlyEqual(dEOdxParam[3], -1.)) {
    if (NRERWidthsParam[0] < 0. && eMin < 0.) {
      xi = xf - 10.;
      yi = yf;
      zi = zf;
    } else {
      r = fdetector->get_radmax() * sqrt(RandomGen::rndm()->rand_uniform());
      phi = 2. * M_PI * RandomGen::rndm()->rand_uniform();
      xi = r * cos(phi);
      yi = r * sin(phi);
    }
  } else {
    string position = muonInitPos;
    string delimiter = ",";
    size_t loc = 0;
    int ii = 0;
    while ((loc = position.find(delimiter)) != string::npos) {
      string token = position.substr(0, loc);
      if (ii == 0)
        xi = stof(token);
      else
        yi = stof(token);
      position.erase(0, loc + delimiter.length());
      ++ii;
    }
    zi = stof(position);
  }
  if (zi <= 0.) zi = fdetector->get_TopDrift();
  double dEOdx, eStep, refEnergy;
  if (eMin < 0.) {
    refEnergy = -eMin;
    if (dEOdxParam[10] > 0. && dEOdxParam[11] != 0.) {
      dEOdx = dEOdxParam[10] * pow(-eMin, dEOdxParam[11]);
      if (dEOdxParam[12] > 0.)
	; //do nothing yet. Old attempts: Gaussian, Expo, Poisson
    } else
      dEOdx = CalcElectronLET(-eMin, ATOM_NUM, dEOdxParam[10]);
    eStep = rho * z_step * 1e2 * RandomGen::rndm()->rand_zero_trunc_gauss(dEOdx,dEOdx);
  } else {
    refEnergy = dEOdxParam[9];
    eStep = eMin * rho * z_step * 1e2;
  }
  double driftTime, vD, keV = 0., Nq_mean;
  int Nph = 0, Ne = 0, Nq = 0;
  double xx = xi, yy = yi, zz = zi;
  if (zf < 0.) zf = 0.;
  double distance = sqrt((xf - xi) * (xf - xi) + (yf - yi) * (yf - yi) +
                         (zf - zi) * (zf - zi));
  double norm[3];
  double xi_tib;
  norm[0] = (xf - xi) / distance;
  norm[1] = (yf - yi) / distance;
  norm[2] = (zf - zi) / distance;
  bool stopCond = false;
  while (!stopCond &&
         (xx * xx + yy * yy) <
             fdetector->get_radmax() * fdetector->get_radmax() &&
         std::abs(refEnergy) > PHE_MIN) {
    if (((zf < zi && zz <= zf) || (zf > zi && zz >= zf)) &&
        ((xx - xf) * (xx - xf) + (yy - yf) * (yy - yf)) <
            4. * z_step * z_step) {
      stopCond = true;
      break;
    }
    // stop making S1 and S2 if particle exits Xe volume, OR runs out of
    // energy (in case of beta)
    if (inField == -1.)
      field = fdetector->FitEF(xx, yy, zz);
    else
      field = inField;
    if (eMin < 0.) {
      if ((keV + eStep) > -eMin) eStep = -eMin - keV;
      if (NRERWidthsParam[0] < 0.) {
        YieldResult yields{};
        Nq_mean = -NRERWidthsParam[0] * eStep;
        double Ni_mean = Nq_mean / (1. + NRERWidthsParam[1]);
        xi_tib = Ni_mean * (NRERWidthsParam[3] / 4.) *
                 pow(eStep, NRERWidthsParam[4] - 1.);
        yields.PhotonYield =
            Ni_mean * (1. + NRERWidthsParam[1] -
                       log(NRERWidthsParam[2] + xi_tib) / xi_tib);
        yields.ElectronYield = Nq_mean - yields.PhotonYield;
        yields.ExcitonRatio = NRERWidthsParam[1];
        yields.Lindhard = 1.;
        yields.ElectricField = field;
        yields.DeltaT_Scint = -999;
        result.yields = yields;
      } else
        result.yields = GetYieldBetaGR(eStep, rho, field);
    } else {
      result.yields = GetYieldBetaGR(refEnergy, rho, field);
    }
    if (eMin < 0. && NRERWidthsParam[0] < 0.) {
      QuantaResult quanta{};
      if (Nq_mean < 1.)
        Nq = 0;
      else //int(ceil(RandomGen::rndm()->rand_gauss(Nq_mean,sqrt(NRERWidthsParam[5]*Nq_mean),true)-0.5))
        Nq = RandomGen::rndm()->binom_draw(NRERWidthsParam[5]*eStep,Nq_mean/(NRERWidthsParam[5]*eStep));
      quanta.recombProb = 1. - log(NRERWidthsParam[2] + xi_tib) / xi_tib;
      if (result.yields.PhotonYield < 1. || Nq <= 0)
        quanta.photons = 0;
      else //int(ceil(RandomGen::rndm()->rand_gauss(result.yields.PhotonYield,sqrt(NRERWidthsParam[6]*result.yields.PhotonYield),true)-0.5))
        quanta.photons = RandomGen::rndm()->binom_draw(Nq,result.yields.PhotonYield/double(Nq));
      quanta.electrons = Nq - quanta.photons;
      quanta.ions = int(ceil(double(Nq) / (1. + NRERWidthsParam[1]) - 0.5));
      quanta.excitons = Nq - quanta.ions;
      quanta.recombProb = 1. - log(NRERWidthsParam[2] + xi_tib) / xi_tib;
      quanta.Variance = NRERWidthsParam[6] * result.yields.PhotonYield;
      result.quanta = quanta;
      Ne += result.quanta.electrons;
    } else
      result.quanta =
          GetQuanta(result.yields, rho, default_NRERWidthsParam, -999.);
    if (eMin > 0.)
      Nph += result.quanta.photons * (eStep / refEnergy);
    else {
      if (NRERWidthsParam[0] >= 0.) {
        Nq = result.quanta.photons + result.quanta.electrons;
        double FanoOverall =
            1.;  // use 6 for ~0.7% energy resolution at 2.6 MeV and 190 V/cm
        double FanoScint =
            200.;  // standin for recombination fluctuations in this approach
        Nq = int(floor(
            RandomGen::rndm()->rand_gauss(Nq, sqrt(FanoOverall * Nq), false) +
            0.5));
        result.quanta.photons =
            int(floor(RandomGen::rndm()->rand_gauss(
                          result.quanta.photons,
                          sqrt(FanoScint * result.quanta.photons), false) +
                      0.5));
        result.quanta.electrons = Nq - result.quanta.photons;
      }
      Nph += result.quanta.photons;
    }
    int index = int(floor(zz / z_step + 0.5));
    if (index >= vTable.size()) index = vTable.size() - 1;
    if (vTable.size() == 0)
      vD = dEOdxParam[7];
    else
      vD = vTable[index];
    driftTime = (fdetector->get_TopDrift() - zz) / vD;
    if (zz >= fdetector->get_cathode() && NRERWidthsParam[0] >= 0.) {
      if (eMin > 0.)
        Ne += result.quanta.electrons *
              exp(-driftTime / fdetector->get_eLife_us()) * (eStep / refEnergy);
      else
        Ne += result.quanta.electrons *
              exp(-driftTime / fdetector->get_eLife_us());
    }
    keV += eStep;
    xx += norm[0] * z_step;
    yy += norm[1] * z_step;
    zz += norm[2] * z_step;
    if (eMin < 0.) {
      refEnergy -= eStep;
      if (dEOdxParam[10] > 0. && dEOdxParam[11] != 0.) {
        dEOdx = dEOdxParam[10] * pow(refEnergy, dEOdxParam[11]);
        if (dEOdxParam[12] > 0.)
          dEOdx = RandomGen::rndm()->rand_gauss(dEOdx, dEOdxParam[12] * dEOdx,
                                                true);
      } else
        dEOdx = CalcElectronLET(refEnergy, ATOM_NUM, dEOdxParam[10]);
      eStep = dEOdx * rho * z_step * 1e2;
    }
    // cerr << keV << "\t\t" << xx << "\t" << yy << "\t" << zz << "\t" << Nph <<
    // "\t" << Ne << endl;
  }
  if (Nph < 0) Nph = 0;
  if (Ne < 0) Ne = 0;
  result.quanta.photons = Nph;
  result.quanta.electrons = Ne;
  pos_x =
      0.5 * (xi + xx);  // approximate things not already done right in loop as
  // middle of detector since muon traverses whole length
  pos_y = 0.5 * (yi + yy);
  pos_z = 0.5 * (zi + zz);
  if (inField == -1.)
    field = fdetector->FitEF(pos_x, pos_y, pos_z);
  else
    field = inField;
  result.yields.DeltaT_Scint = pos_z;
  result.yields.ElectricField = field;
  return result;
}